

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynVariableDefinitions * ParseVariableDefinitions(ParseContext *ctx,bool classMembers)

{
  Lexeme *begin;
  SynVariableDefinition *pSVar1;
  int iVar2;
  SynAlign *pSVar3;
  SynBase *pSVar4;
  SynVariableDefinition *pSVar5;
  undefined4 extraout_var;
  Lexeme *pLVar6;
  LexemeType LVar7;
  char *msg;
  IntrusiveList<SynVariableDefinition> definitions;
  SynVariableDefinitions *this;
  
  begin = ctx->currentLexeme;
  pSVar3 = ParseAlign(ctx);
  pSVar4 = ParseType(ctx,(bool *)0x0,false);
  if (pSVar4 == (SynBase *)0x0) {
LAB_001fa522:
    ctx->currentLexeme = begin;
    return (SynVariableDefinitions *)0x0;
  }
  definitions.head = (SynVariableDefinition *)0x0;
  definitions.tail = (SynVariableDefinition *)0x0;
  pSVar5 = ParseVariableDefinition(ctx);
  if (pSVar5 == (SynVariableDefinition *)0x0) {
    if (pSVar3 != (SynAlign *)0x0) {
      anon_unknown.dwarf_153727::Report
                (ctx,ctx->currentLexeme,
                 "ERROR: variable or class definition is expected after alignment specifier");
    }
    goto LAB_001fa522;
  }
  do {
    IntrusiveList<SynVariableDefinition>::push_back(&definitions,pSVar5);
    pLVar6 = ctx->currentLexeme;
    LVar7 = pLVar6->type;
    if (LVar7 != lex_comma) {
      if (classMembers) goto LAB_001fa536;
      goto LAB_001fa559;
    }
    ctx->currentLexeme = pLVar6 + 1;
    pSVar5 = ParseVariableDefinition(ctx);
  } while (pSVar5 != (SynVariableDefinition *)0x0);
  if (classMembers) {
    anon_unknown.dwarf_153727::Report
              (ctx,ctx->currentLexeme,"ERROR: member name expected after \',\'");
LAB_001fa536:
    msg = "ERROR: \';\' not found after class member list";
  }
  else {
    anon_unknown.dwarf_153727::Report
              (ctx,ctx->currentLexeme,"ERROR: next variable definition excepted after \',\'");
    pLVar6 = ctx->currentLexeme;
    LVar7 = pLVar6->type;
LAB_001fa559:
    if (LVar7 == lex_obracket) {
      msg = "ERROR: array size must be specified after type name";
    }
    else {
      if (LVar7 == lex_semicolon) {
        ctx->currentLexeme = pLVar6 + 1;
        goto LAB_001fa58d;
      }
      msg = "ERROR: \';\' not found after variable definition";
    }
  }
  anon_unknown.dwarf_153727::CheckConsume(ctx,lex_semicolon,msg);
LAB_001fa58d:
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
  this = (SynVariableDefinitions *)CONCAT44(extraout_var,iVar2);
  pLVar6 = ParseContext::Previous(ctx);
  pSVar1 = definitions.tail;
  pSVar5 = definitions.head;
  SynBase::SynBase((SynBase *)this,0x34,begin,pLVar6);
  (this->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e4e70;
  this->align = pSVar3;
  this->type = pSVar4;
  (this->definitions).head = pSVar5;
  (this->definitions).tail = pSVar1;
  return this;
}

Assistant:

SynVariableDefinitions* ParseVariableDefinitions(ParseContext &ctx, bool classMembers)
{
	Lexeme *start = ctx.currentLexeme;

	SynAlign *align = ParseAlign(ctx);

	if(SynBase *type = ParseType(ctx))
	{
		IntrusiveList<SynVariableDefinition> definitions;

		SynVariableDefinition *definition = ParseVariableDefinition(ctx);

		if(!definition)
		{
			if(align)
				Report(ctx, ctx.Current(), "ERROR: variable or class definition is expected after alignment specifier");

			// Backtrack
			ctx.currentLexeme = start;

			return NULL;
		}

		definitions.push_back(definition);

		while(ctx.Consume(lex_comma))
		{
			definition = ParseVariableDefinition(ctx);

			if(!definition)
			{
				if(classMembers)
					Report(ctx, ctx.Current(), "ERROR: member name expected after ','");
				else
					Report(ctx, ctx.Current(), "ERROR: next variable definition excepted after ','");

				break;
			}

			definitions.push_back(definition);
		}

		if(classMembers)
		{
			CheckConsume(ctx, lex_semicolon, "ERROR: ';' not found after class member list");
		}
		else if(!ctx.Consume(lex_semicolon))
		{
			if(ctx.Peek() == lex_obracket)
				CheckConsume(ctx, lex_semicolon, "ERROR: array size must be specified after type name");
			else
				CheckConsume(ctx, lex_semicolon, "ERROR: ';' not found after variable definition");
		}

		return new (ctx.get<SynVariableDefinitions>()) SynVariableDefinitions(start, ctx.Previous(), align, type, definitions);
	}
	
	// Backtrack
	ctx.currentLexeme = start;

	return NULL;
}